

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O3

void __thiscall Inject::ctor_inject::ctor_inject(ctor_inject *this,type *service1)

{
  int iVar1;
  undefined4 extraout_var;
  undefined **local_f0;
  undefined1 local_e8;
  undefined8 *local_e0;
  char *local_d8;
  unique_id local_d0;
  long local_c8;
  unique_id *local_c0;
  long *local_b8;
  undefined1 local_b0 [8];
  undefined8 local_a8;
  shared_count sStack_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  undefined **local_68;
  undefined1 local_60;
  undefined8 *local_58;
  unique_id **local_50;
  undefined **local_48;
  undefined1 local_40;
  undefined8 *local_38;
  long **local_30;
  
  this->ctor_num = 1;
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0x247);
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_00163f68;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  if (service1->px != (element_type *)0x0) {
    iVar1 = (**service1->px->_vptr_service)();
    local_c8 = CONCAT44(extraout_var,iVar1);
    local_d0 = inject::id_of<Inject::impl1>::id();
    local_c0 = &local_d0;
    local_b0[0] = CONCAT44(extraout_var,iVar1) == local_d0;
    local_a8 = 0;
    sStack_a0.pi_ = (sp_counted_base *)0x0;
    local_78 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
    ;
    local_70 = "";
    local_30 = &local_b8;
    local_40 = 0;
    local_48 = &PTR__lazy_ostream_00163fb8;
    local_38 = &boost::unit_test::lazy_ostream::inst;
    local_50 = &local_c0;
    local_60 = 0;
    local_68 = &PTR__lazy_ostream_00163fb8;
    local_58 = &boost::unit_test::lazy_ostream::inst;
    local_b8 = &local_c8;
    boost::test_tools::tt_detail::report_assertion
              (local_b0,&local_f0,&local_78,0x247,1,2,2,"service1->id()",&local_48,
               "id_of<impl1>::id()",&local_68);
    boost::detail::shared_count::~shared_count(&sStack_a0);
    return;
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Inject::service>::operator->() const [T = Inject::service]"
               );
}

Assistant:

ctor_inject(
            context<>::ptr<service>::type service1) {
        ctor_num = 1;
        BOOST_CHECK_EQUAL(service1->id(), id_of<impl1>::id());
    }